

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

void __thiscall Jupiter::HTTP::Server::Data::Data(Data *this)

{
  Host *this_00;
  _Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false> local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  string local_48;
  
  (this->m_sessions).
  super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sessions).
  super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ports).
  super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ports).
  super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_hosts).
  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ports).
  super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_hosts).
  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_hosts).
  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sessions).
  super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->session_timeout).__r = 2000;
  (this->keep_alive_session_timeout).__r = 5000;
  this->max_request_size = 0x2000;
  this->permit_keept_alive = true;
  local_60 = 0;
  local_58 = 0;
  local_68 = &local_58;
  this_00 = (Host *)operator_new(0x60);
  local_48.field_2._M_allocated_capacity = CONCAT71(uStack_57,local_58);
  local_48.field_2._8_8_ = uStack_50;
  local_48._M_string_length = 0;
  local_60 = 0;
  local_58 = 0;
  local_68 = &local_58;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  Host::Host(this_00,&local_48);
  local_70._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>,std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>>>
  ::
  emplace_back<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>>
            ((vector<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>,std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,std::default_delete<Jupiter::HTTP::Server::Host>>>>
              *)this,(unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
                      *)&local_70);
  if (local_70._M_head_impl != (Host *)0x0) {
    (*((local_70._M_head_impl)->super_Directory)._vptr_Directory[6])();
  }
  local_70._M_head_impl = (Host *)0x0;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return;
}

Assistant:

Jupiter::HTTP::Server::Data::Data() {
	// hosts[0] is always the "global" namespace.
	m_hosts.push_back(std::make_unique<Host>(""s));
}